

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall
ODDLParser::OpenDDLExport::writeProperties(OpenDDLExport *this,DDLNode *node,string *statement)

{
  char *__s;
  allocator<char> local_59;
  string local_58 [39];
  byte local_31;
  Property *pPStack_30;
  bool first;
  Property *prop;
  string *statement_local;
  DDLNode *node_local;
  OpenDDLExport *this_local;
  
  if (node == (DDLNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    prop = (Property *)statement;
    statement_local = &node->m_type;
    node_local = (DDLNode *)this;
    pPStack_30 = DDLNode::getProperties(node);
    if (pPStack_30 == (Property *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      if (pPStack_30 != (Property *)0x0) {
        std::__cxx11::string::operator+=((string *)prop,"(");
        local_31 = 1;
        for (; pPStack_30 != (Property *)0x0; pPStack_30 = pPStack_30->m_next) {
          if ((local_31 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)prop,", ");
          }
          else {
            local_31 = 0;
          }
          __s = pPStack_30->m_key->m_buffer;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_58,__s,&local_59);
          std::__cxx11::string::operator+=((string *)prop,local_58);
          std::__cxx11::string::~string(local_58);
          std::allocator<char>::~allocator(&local_59);
          std::__cxx11::string::operator+=((string *)prop," = ");
          writeValue(this,pPStack_30->m_value,(string *)prop);
        }
        std::__cxx11::string::operator+=((string *)prop,")");
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OpenDDLExport::writeProperties( DDLNode *node, std::string &statement ) {
    if ( ddl_nullptr == node ) {
        return false;
    }

    Property *prop( node->getProperties() );
    // if no properties are there, return
    if ( ddl_nullptr == prop ) {
        return true;
    }

    if ( ddl_nullptr != prop ) {
        // for instance (attrib = "position", bla=2)
        statement += "(";
        bool first( true );
        while ( ddl_nullptr != prop ) {
            if (!first) {
                statement += ", ";
            } else {
                first = false;
            }
            statement += std::string( prop->m_key->m_buffer );
            statement += " = ";
            writeValue( prop->m_value, statement );
            prop = prop->m_next;
        }

        statement += ")";
    }

    return true;
}